

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasByInstruction
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas,VRInstruction *vrinst)

{
  ulong *puVar1;
  Instruction *pIVar2;
  byte bVar3;
  AllocatedArea *area;
  long *plVar4;
  long lVar5;
  const_iterator cVar6;
  uint uVar7;
  bool bVar8;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar9;
  undefined1 auVar10 [16];
  AnalysisOptions options;
  key_type local_88;
  AnalysisOptions local_68;
  
  pIVar2 = vrinst->instruction;
  if (pIVar2[0x10] == (Instruction)0x53) {
    lVar5 = *(long *)(pIVar2 + -0x20);
    if ((((lVar5 != 0) && (*(char *)(lVar5 + 0x10) == '\0')) &&
        (*(long *)(lVar5 + 0x18) == *(long *)(pIVar2 + 0x48))) &&
       (((*(byte *)(lVar5 + 0x21) & 0x20) != 0 && (*(int *)(lVar5 + 0x24) == 0xa4)))) {
      pVar9 = getEqualArea(this,&location->relations,
                           *(Value **)
                            (pIVar2 + (0x20 - (ulong)(uint)(*(int *)(pIVar2 + 0x14) << 5))));
      bVar3 = (byte)pVar9.first & 0x3f;
      puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (pVar9.first >> 6);
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      if (pIVar2[0x10] != (Instruction)0x53) {
        return;
      }
    }
    lVar5 = *(long *)(pIVar2 + -0x20);
    if (((lVar5 != 0) && (*(char *)(lVar5 + 0x10) == '\0')) &&
       (*(long *)(lVar5 + 0x18) == *(long *)(pIVar2 + 0x48))) {
      AnalysisOptions::AnalysisOptions(&local_68);
      auVar10 = llvm::Value::getName();
      lVar5 = auVar10._0_8_;
      if (lVar5 == 0) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,lVar5,auVar10._8_8_ + lVar5);
      }
      cVar6 = std::
              _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
              ::find(&local_68.allocationFunctions._M_t,&local_88);
      if ((_Rb_tree_header *)cVar6._M_node ==
          &local_68.allocationFunctions._M_t._M_impl.super__Rb_tree_header) {
        bVar8 = false;
      }
      else {
        bVar8 = cVar6._M_node[2]._M_color == 4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if (bVar8) {
        pVar9 = getEqualArea(this,&location->relations,
                             *(Value **)(pIVar2 + -(ulong)(uint)(*(int *)(pIVar2 + 0x14) << 5)));
        if (pVar9.second == (AllocatedArea *)0x0) {
          if (*(char *)(*(long *)(pIVar2 + -(ulong)(uint)(*(int *)(pIVar2 + 0x14) << 5)) + 0x10) !=
              '\x12') {
            invalidateHeapAllocatedAreas(this,validAreas);
          }
        }
        else {
          bVar3 = (byte)pVar9.first & 0x3f;
          puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (pVar9.first >> 6);
          *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
      }
      auVar10 = llvm::Value::getName();
      if ((auVar10._8_8_ == 4) && (*auVar10._0_8_ == 0x65657266)) {
        pVar9 = getEqualArea(this,&location->relations,
                             *(Value **)(pIVar2 + -(ulong)(uint)(*(int *)(pIVar2 + 0x14) << 5)));
        if (pVar9.second == (AllocatedArea *)0x0) {
          if (*(char *)(*(long *)(pIVar2 + -(ulong)(uint)(*(int *)(pIVar2 + 0x14) << 5)) + 0x10) !=
              '\x12') {
            invalidateHeapAllocatedAreas(this,validAreas);
          }
        }
        else {
          bVar3 = (byte)pVar9.first & 0x3f;
          puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (pVar9.first >> 6);
          *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
      }
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
      ::_M_erase(&local_68.allocationFunctions._M_t,
                 (_Link_type)
                 local_68.allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
    }
  }
  else if (pIVar2[0x10] == (Instruction)0x3a) {
    plVar4 = *(long **)(this + 0xb8);
    if (plVar4 != *(long **)(this + 0xc0)) {
      uVar7 = 0;
      do {
        if ((Instruction *)*plVar4 == pIVar2) goto LAB_00126ccd;
        uVar7 = uVar7 + 1;
        plVar4 = plVar4 + 4;
      } while (plVar4 != *(long **)(this + 0xc0));
    }
    uVar7 = 0;
LAB_00126ccd:
    puVar1 = (validAreas->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar7 >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasByInstruction(
        VRLocation &location, std::vector<bool> &validAreas,
        VRInstruction *vrinst) const {
    const llvm::Instruction *inst = vrinst->getInstruction();
    unsigned index = 0;
    const AllocatedArea *area = nullptr;

    // every memory allocated on stack is considered allocated successfully
    if (llvm::isa<llvm::AllocaInst>(inst)) {
        std::tie(index, area) = getAllocatedAreaFor(inst);
        assert(area);
        validAreas[index] = true;
    }

    // if came across lifetime_end call, then mark memory whose scope ended
    // invalid
    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (intrinsic->getIntrinsicID() == llvm::Intrinsic::lifetime_end) {
            std::tie(index, area) =
                    getEqualArea(location.relations, intrinsic->getOperand(1));
            assert(area);
            validAreas[index] = false;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        auto *function = call->getCalledFunction();

        if (!function)
            return;

        AnalysisOptions options;
        if (options.getAllocationFunction(function->getName().str()) ==
            AllocationFunction::REALLOC) {
            // if realloc of memory occured, the reallocated memory cannot
            // be considered valid until the realloc is proven unsuccessful
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));
            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been reallocated and
                // thus possibly invalidated, so it may have been any of
                // them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }

        if (function->getName().equals("free")) {
            // if free occures, the freed memory cannot be considered valid
            // anymore
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));

            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been freed, so it may
                // have been any of them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }
    }
}